

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void magmacrypt(gost_ctx *c,byte *in,byte *out)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar5;
  word32 wVar6;
  uint uVar7;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  gost_ctx *in_RDI;
  word32 n2;
  word32 n1;
  
  uVar5 = CONCAT13(in_RSI[4],CONCAT12(in_RSI[5],CONCAT11(in_RSI[6],in_RSI[7])));
  uVar1 = in_RSI[3];
  uVar2 = in_RSI[2];
  uVar3 = in_RSI[1];
  uVar4 = *in_RSI;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar7 = wVar6 ^ CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar5 = wVar6 ^ uVar5;
  wVar6 = f(in_RDI,uVar5 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar7 = wVar6 ^ uVar7;
  wVar6 = f(in_RDI,uVar7 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar5 = wVar6 ^ uVar5;
  in_RDX[7] = (char)uVar7;
  in_RDX[6] = (char)(uVar7 >> 8);
  in_RDX[5] = (char)(uVar7 >> 0x10);
  in_RDX[4] = (char)(uVar7 >> 0x18);
  in_RDX[3] = (char)uVar5;
  in_RDX[2] = (char)(uVar5 >> 8);
  in_RDX[1] = (char)(uVar5 >> 0x10);
  *in_RDX = (char)(uVar5 >> 0x18);
  return;
}

Assistant:

void magmacrypt(gost_ctx * c, const byte * in, byte * out)
{
    register word32 n1, n2;     /* As named in the GOST */
    n1 = in[7-0] | (in[7-1] << 8) | (in[7-2] << 16) | ((word32) in[7-3] << 24);
    n2 = in[7-4] | (in[7-5] << 8) | (in[7-6] << 16) | ((word32) in[7-7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    out[7-0] = (byte) (n2 & 0xff);
    out[7-1] = (byte) ((n2 >> 8) & 0xff);
    out[7-2] = (byte) ((n2 >> 16) & 0xff);
    out[7-3] = (byte) (n2 >> 24);
    out[7-4] = (byte) (n1 & 0xff);
    out[7-5] = (byte) ((n1 >> 8) & 0xff);
    out[7-6] = (byte) ((n1 >> 16) & 0xff);
    out[7-7] = (byte) (n1 >> 24);
}